

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float32_to_float128_m68k(float32 a,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  float128 fVar8;
  
  if ((status->flush_inputs_to_zero != '\0') && ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    a = a & 0x80000000;
  }
  uVar3 = a & 0x7fffff;
  uVar6 = (ulong)(a >> 0x1f);
  if ((char)(a >> 0x17) == '\0') {
    if (uVar3 != 0) {
      uVar4 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar3 = uVar3 << ((char)(uVar4 ^ 0x1f) - 8U & 0x1f);
      uVar4 = 8 - (uVar4 ^ 0x1f);
      goto LAB_006c6023;
    }
    uVar6 = uVar6 << 0x3f;
  }
  else {
    uVar4 = a >> 0x17 & 0xff;
    if (uVar4 != 0xff) {
LAB_006c6023:
      auVar1._8_8_ = 0;
      auVar1._0_8_ = ((ulong)(uVar4 + 0x3f80) << 0x30) + (uVar6 << 0x3f | (ulong)uVar3 << 0x19);
      return (float128)(auVar1 << 0x40);
    }
    if (uVar3 != 0) {
      if ((a & 0x3fffff) != 0 && (a & 0x7fc00000) == 0x7f800000) {
        status->float_exception_flags = status->float_exception_flags | 1;
      }
      bVar7 = status->default_nan_mode != '\0';
      uVar5 = 0x7fffffffffffffff;
      if (!bVar7) {
        uVar5 = uVar6 << 0x3f | (ulong)a << 0x19 | 0x7fff000000000000;
      }
      fVar8.low = -(ulong)bVar7;
      fVar8.high = uVar5;
      return fVar8;
    }
    uVar6 = uVar6 << 0x3f | 0x7fff000000000000;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  return (float128)(auVar2 << 0x40);
}

Assistant:

float32 float32_squash_input_denormal(float32 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float32_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float32_set_sign(float32_zero, p.sign);
        }
    }
    return a;
}